

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_fast_union_64(void **param_1)

{
  Roaring64Map expected;
  Roaring64Map actual;
  Roaring64Map *maps [3];
  Roaring64Map r2_map;
  Roaring64Map r1_map;
  Roaring64Map r0_map;
  size_t r2_bitmask;
  size_t r1_bitmask;
  size_t r0_bitmask;
  uint32_t bitmask_limit;
  uint32_t num_slots_to_test;
  anon_class_1_0_00000001 update;
  int line;
  Roaring64Map *this;
  Roaring64Map *in_stack_fffffffffffffe88;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe90;
  Roaring64Map *in_stack_fffffffffffffec0;
  Roaring64Map *in_stack_fffffffffffffec8;
  Roaring64Map local_68;
  long local_30;
  long local_28;
  long local_20;
  undefined4 local_14;
  undefined4 local_10;
  
  local_10 = 4;
  local_14 = 0x10;
  for (local_20 = 0; local_20 != 0x10; local_20 = local_20 + 1) {
    for (local_28 = 0; local_28 != 0x10; local_28 = local_28 + 1) {
      for (local_30 = 0; local_30 != 0x10; local_30 = local_30 + 1) {
        this = &local_68;
        roaring::Roaring64Map::Roaring64Map(this);
        roaring::Roaring64Map::Roaring64Map(this);
        roaring::Roaring64Map::Roaring64Map(this);
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (uint32_t)((ulong)this >> 0x20),(uint32_t)this);
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (uint32_t)((ulong)this >> 0x20),(uint32_t)this);
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (uint32_t)((ulong)this >> 0x20),(uint32_t)this);
        roaring::Roaring64Map::fastunion
                  (expected.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (Roaring64Map **)
                   expected.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
        line = (int)((ulong)&stack0xfffffffffffffe88 >> 0x20);
        roaring::Roaring64Map::Roaring64Map(this);
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (uint32_t)((ulong)this >> 0x20),(uint32_t)this);
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (uint32_t)((ulong)this >> 0x20),(uint32_t)this);
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (uint32_t)((ulong)this >> 0x20),(uint32_t)this);
        roaring::Roaring64Map::operator==(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        _assert_true((unsigned_long)in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                     (char *)this,line);
        roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1121c0);
        roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1121ca);
        roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1121d7);
        roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1121e4);
        roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1121f1);
      }
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_cpp_fast_union_64) {
    auto update = [](Roaring64Map *dest, uint32_t bitmask, uint32_t offset) {
        for (uint32_t i = 0; i != 32; ++i) {
            if ((bitmask & (1 << i)) != 0) {
                dest->add(offset + i);
            }
        }
    };

    // Generate three Roaring64Maps that have a variety of combinations of
    // present and absent slots and calculate their union with fastunion.
    const uint32_t num_slots_to_test = 4;
    const uint32_t bitmask_limit = 1 << num_slots_to_test;

    for (size_t r0_bitmask = 0; r0_bitmask != bitmask_limit; ++r0_bitmask) {
        for (size_t r1_bitmask = 0; r1_bitmask != bitmask_limit; ++r1_bitmask) {
            for (size_t r2_bitmask = 0; r2_bitmask != bitmask_limit;
                 ++r2_bitmask) {
                Roaring64Map r0_map, r1_map, r2_map;
                update(&r0_map, r0_bitmask, 0);
                update(&r1_map, r1_bitmask, 0x1000);
                update(&r2_map, r2_bitmask, 0x2000);

                const Roaring64Map *maps[] = {&r0_map, &r1_map, &r2_map};
                auto actual = Roaring64Map::fastunion(3, maps);

                Roaring64Map expected;
                update(&expected, r0_bitmask, 0);
                update(&expected, r1_bitmask, 0x1000);
                update(&expected, r2_bitmask, 0x2000);

                assert_true(expected == actual);
            }
        }
    }
}